

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# hfile.c
# Opt level: O1

int fd_flush(hFILE *fpv)

{
  int iVar1;
  int *piVar2;
  
  while( true ) {
    iVar1 = fsync(*(int *)&fpv[1].buffer);
    if (iVar1 < 0) {
      piVar2 = __errno_location();
      if ((*piVar2 == 0x5f) || (*piVar2 == 0x16)) {
        iVar1 = 0;
      }
    }
    if (-1 < iVar1) break;
    piVar2 = __errno_location();
    if (*piVar2 != 4) {
      return iVar1;
    }
  }
  return iVar1;
}

Assistant:

static int fd_flush(hFILE *fpv)
{
    hFILE_fd *fp = (hFILE_fd *) fpv;
    int ret;
    do {
#ifdef HAVE_FDATASYNC
        ret = fdatasync(fp->fd);
#else
        ret = fsync(fp->fd);
#endif
        // Ignore invalid-for-fsync(2) errors due to being, e.g., a pipe,
        // and operation-not-supported errors (Mac OS X)
        if (ret < 0 && (errno == EINVAL || errno == ENOTSUP)) ret = 0;
    } while (ret < 0 && errno == EINTR);
    return ret;
}